

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

size_t json_object_get_cell_ix
                 (JSON_Object *object,char *key,size_t key_len,unsigned_long hash,
                 parson_bool_t *out_found)

{
  ulong uVar1;
  size_t *psVar2;
  size_t sVar3;
  char *__s;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = object->cell_capacity;
  *out_found = 0;
  if (uVar1 != 0) {
    psVar2 = object->cells;
    uVar7 = 0;
    uVar8 = 1;
    do {
      uVar7 = uVar7 + (uVar1 - 1 & hash) & uVar1 - 1;
      sVar3 = psVar2[uVar7];
      if (sVar3 == 0xffffffffffffffff) {
        return uVar7;
      }
      if (object->hashes[sVar3] == hash) {
        __s = object->names[sVar3];
        sVar6 = strlen(__s);
        if ((sVar6 == key_len) && (iVar5 = strncmp(key,__s,key_len), iVar5 == 0)) {
          *out_found = 1;
          return uVar7;
        }
      }
      bVar4 = uVar8 < uVar1;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t json_object_get_cell_ix(const JSON_Object *object, const char *key, size_t key_len, unsigned long hash, parson_bool_t *out_found) {
    size_t cell_ix = hash & (object->cell_capacity - 1);
    size_t cell = 0;
    size_t ix = 0;
    unsigned int i = 0;
    unsigned long hash_to_check = 0;
    const char *key_to_check = NULL;
    size_t key_to_check_len = 0;

    *out_found = PARSON_FALSE;

    for (i = 0; i < object->cell_capacity; i++) {
        ix = (cell_ix + i) & (object->cell_capacity - 1);
        cell = object->cells[ix];
        if (cell == OBJECT_INVALID_IX) {
            return ix;
        }
        hash_to_check = object->hashes[cell];
        if (hash != hash_to_check) {
            continue;
        }
        key_to_check = object->names[cell];
        key_to_check_len = strlen(key_to_check);
        if (key_to_check_len == key_len && strncmp(key, key_to_check, key_len) == 0) {
            *out_found = PARSON_TRUE;
            return ix;
        }
    }
    return OBJECT_INVALID_IX;
}